

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

Iterator<int,_false,_std::allocator<unsigned_long>_> * __thiscall
andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
          (Iterator<int,_false,_std::allocator<unsigned_long>_> *this)

{
  View<int,_false,_std::allocator<unsigned_long>_> *pVVar1;
  ulong uVar2;
  pointer puVar3;
  size_t sVar4;
  size_t sVar5;
  reference piVar6;
  runtime_error *this_00;
  pointer puVar7;
  size_t dimension;
  long lVar8;
  unsigned_long uVar9;
  bool bVar10;
  
  pVVar1 = this->view_;
  if (pVVar1 == (View<int,_false,_std::allocator<unsigned_long>_> *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_001ebdd8:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->index_ < (pVVar1->geometry_).size_) {
    this->index_ = this->index_ + 1;
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
    if ((pVVar1->geometry_).isSimple_ == true) {
      this->pointer_ = this->pointer_ + 1;
    }
    else {
      pVVar1 = this->view_;
      uVar2 = (pVVar1->geometry_).size_;
      if (this->index_ < uVar2) {
        View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
        puVar7 = (this->coordinates_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar3 = (this->coordinates_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((pVVar1->geometry_).coordinateOrder_ == LastMajorOrder) {
          if (puVar3 != puVar7) {
            dimension = 0;
            do {
              uVar9 = puVar7[dimension];
              sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape(this->view_,dimension)
              ;
              sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::strides
                                (this->view_,dimension);
              if (uVar9 != sVar4 - 1) goto LAB_001ebd95;
              puVar7 = (this->coordinates_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              this->pointer_ = this->pointer_ + -(sVar5 * puVar7[dimension]);
              puVar7[dimension] = 0;
              dimension = dimension + 1;
            } while (dimension <
                     (ulong)((long)(this->coordinates_).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3));
          }
        }
        else {
          lVar8 = (long)puVar3 - (long)puVar7 >> 3;
          dimension = lVar8 - 1;
          uVar9 = puVar7[lVar8 + -1];
          while (sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::shape
                                   (this->view_,dimension), uVar9 == sVar5 - 1) {
            sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::strides(this->view_,dimension)
            ;
            puVar7 = (this->coordinates_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            this->pointer_ = this->pointer_ + -(sVar5 * puVar7[dimension]);
            puVar7[dimension] = 0;
            bVar10 = dimension == 0;
            dimension = dimension - 1;
            if (bVar10) goto LAB_001ebda5;
            uVar9 = puVar7[dimension];
          }
          sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::strides(this->view_,dimension);
LAB_001ebd95:
          this->pointer_ = this->pointer_ + sVar5;
          puVar7 = (this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + dimension;
          *puVar7 = *puVar7 + 1;
        }
      }
      else {
        piVar6 = View<int,_false,_std::allocator<unsigned_long>_>::operator()(pVVar1,uVar2 - 1);
        this->pointer_ = piVar6 + 1;
        pVVar1 = this->view_;
        View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
        if ((pVVar1->geometry_).coordinateOrder_ == LastMajorOrder) {
          puVar7 = (this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *puVar7 = *puVar7 + 1;
        }
        else {
          if (this->view_->data_ == (pointer)0x0) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_001ebdd8;
          }
          puVar7 = (this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + ((this->view_->geometry_).dimension_ - 1);
          *puVar7 = *puVar7 + 1;
        }
      }
    }
  }
LAB_001ebda5:
  testInvariant(this);
  return this;
}

Assistant:

inline Iterator<T, isConst, A>&
Iterator<T, isConst, A>::operator++()
{
    marray_detail::Assert(MARRAY_NO_DEBUG || view_ != 0);
    if(index_ < view_->size()) { // view initialized and iterator not at the end
        ++index_;
        if(view_->isSimple()) {
            ++pointer_;
        }
        else {
            if(index_ < view_->size()) {
                if(view_->coordinateOrder() == LastMajorOrder) {
                    for(std::size_t j=0; j<coordinates_.size(); ++j) {
                        if(coordinates_[j] == view_->shape(j)-1) {
                            pointer_ -= view_->strides(j) * coordinates_[j];
                            coordinates_[j] = 0;
                        }
                        else {
                            pointer_ += view_->strides(j);
                            ++coordinates_[j];
                            break;
                        }
                    }
                }
                else { // FirstMajorOrder
                    std::size_t j = coordinates_.size() - 1;
                    for(;;) {
                        if(coordinates_[j] == view_->shape(j)-1) {
                            pointer_ -= view_->strides(j) * coordinates_[j];
                            coordinates_[j] = 0;
                        }
                        else {
                            pointer_ += view_->strides(j);
                            ++coordinates_[j];
                            break;
                        }
                        if(j == 0) {
                            break;
                        }
                        else {
                            --j;
                        }
                    }
                }
            }
            else {
                // set to end iterator
                pointer_ = &((*view_)(view_->size()-1)) + 1;
                if(view_->coordinateOrder() == LastMajorOrder) {
                    ++coordinates_[0];
                }
                else { // FirstMajorOrder
                    ++coordinates_[view_->dimension()-1];
                }
            }
        }
    }
    testInvariant();
    return *this;
}